

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::
WriteValue<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality>
          (Serializer *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
          *map)

{
  _Hash_node_base *p_Var1;
  
  (*this->_vptr_Serializer[8])(this,(map->_M_h)._M_element_count);
  for (p_Var1 = (map->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    (*this->_vptr_Serializer[6])(this);
    (*this->_vptr_Serializer[2])(this,0,"key");
    (*this->_vptr_Serializer[0x1c])(this,p_Var1 + 1);
    (*this->_vptr_Serializer[3])(this);
    (*this->_vptr_Serializer[2])(this,1,"value");
    WriteValue<duckdb::ParsedExpression>(this,(ParsedExpression *)p_Var1[5]._M_nxt);
    (*this->_vptr_Serializer[3])(this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const duckdb::unordered_map<K, V, HASH, CMP> &map) {
		auto count = map.size();
		OnListBegin(count);
		for (auto &item : map) {
			OnObjectBegin();
			WriteProperty(0, "key", item.first);
			WriteProperty(1, "value", item.second);
			OnObjectEnd();
		}
		OnListEnd();
	}